

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O2

int kj::runMainAndExit(ProcessContext *context,MainFunc *func,int argc,char **argv)

{
  long lVar1;
  size_t sVar2;
  Exception *pEVar3;
  size_t *psVar4;
  char *pcVar5;
  ulong uVar6;
  Array<kj::StringPtr> params_heap;
  char **argv_local;
  StringPtr *local_3a8;
  ulong local_3a0;
  Runnable local_398;
  MainFunc *local_390;
  char ***local_388;
  StringPtr **local_380;
  StringPtr params_stack [8];
  NullableValue<kj::Exception> local_2f0;
  Fault f;
  char local_188 [344];
  
  argv_local = argv;
  if (0 < argc) {
    local_3a0 = (ulong)(argc - 1);
    lVar1 = 0;
    do {
      *(char **)((long)&params_stack[0].content.ptr + lVar1) = "";
      *(undefined8 *)((long)&params_stack[0].content.size_ + lVar1) = 1;
      lVar1 = lVar1 + 0x10;
    } while (lVar1 != 0x80);
    pEVar3 = (Exception *)argv;
    if ((uint)argc < 10) {
      local_3a8 = params_stack;
    }
    else {
      local_3a8 = _::HeapArrayDisposer::allocate<kj::StringPtr>(local_3a0);
    }
    psVar4 = &(local_3a8->content).size_;
    for (uVar6 = 1; uVar6 < (uint)argc; uVar6 = uVar6 + 1) {
      pcVar5 = argv[uVar6];
      sVar2 = strlen(pcVar5);
      ((ArrayPtr<const_char> *)(psVar4 + -1))->ptr = pcVar5;
      *psVar4 = sVar2 + 1;
      psVar4 = psVar4 + 2;
    }
    local_398._vptr_Runnable = (_func_int **)&PTR_run_001d5c08;
    local_388 = &argv_local;
    local_380 = &local_3a8;
    local_390 = func;
    _::runCatchingExceptions((Maybe<kj::Exception> *)&local_2f0,&local_398);
    _::NullableValue<kj::Exception>::NullableValue((NullableValue<kj::Exception> *)&f,&local_2f0);
    _::NullableValue<kj::Exception>::~NullableValue(&local_2f0);
    if ((char)f.exception == '\x01') {
      str<char_const(&)[28],kj::Exception&>
                ((String *)&local_2f0,(kj *)"*** Uncaught exception ***\n",(char (*) [28])local_188,
                 pEVar3);
      pcVar5 = "";
      if (local_2f0.field_1.value.ownFile.content.ptr != (char *)0x0) {
        pcVar5 = (char *)local_2f0._0_8_;
      }
      (*context->_vptr_ProcessContext[3])
                (context,pcVar5,
                 local_2f0.field_1.value.ownFile.content.ptr +
                 (local_2f0.field_1.value.ownFile.content.ptr == (char *)0x0));
      Array<char>::~Array((Array<char> *)&local_2f0);
    }
    _::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&f);
    (*context->_vptr_ProcessContext[1])(context);
  }
  _::Debug::Fault::Fault
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/main.c++"
             ,0xdd,FAILED,"argc > 0","");
  _::Debug::Fault::fatal(&f);
}

Assistant:

int runMainAndExit(ProcessContext& context, MainFunc&& func, int argc, char* argv[]) {
  setStandardIoMode(STDIN_FILENO);
  setStandardIoMode(STDOUT_FILENO);
  setStandardIoMode(STDERR_FILENO);

#if !KJ_NO_EXCEPTIONS
  try {
#endif
    KJ_ASSERT(argc > 0);

    KJ_STACK_ARRAY(StringPtr, params, argc - 1, 8, 32);
    for (int i = 1; i < argc; i++) {
      params[i - 1] = argv[i];
    }

    KJ_IF_MAYBE(exception, runCatchingExceptions([&]() {
      func(argv[0], params);
    })) {
      context.error(str("*** Uncaught exception ***\n", *exception));
    }
    context.exit();
#if !KJ_NO_EXCEPTIONS
  } catch (const TopLevelProcessContext::CleanShutdownException& e) {
    return e.exitCode;
  }
#endif
  KJ_CLANG_KNOWS_THIS_IS_UNREACHABLE_BUT_GCC_DOESNT
}